

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

USTATUS __thiscall
FfsParser::parseVersionSectionHeader
          (FfsParser *this,UByteArray *section,UINT32 localOffset,UModelIndex *parent,
          UModelIndex *index,bool insertIntoTree)

{
  byte type;
  char cVar1;
  ushort uVar2;
  TreeModel *this_00;
  bool bVar3;
  UINT32 UVar4;
  ushort *puVar5;
  uint uVar6;
  UINT8 *ffsSize;
  UByteArray local_108;
  UModelIndex parentVolumeIndex;
  UByteArray header;
  CBString name;
  UByteArray body;
  CBString local_78;
  UModelIndex local_60;
  CBString info;
  
  if (((section->d)._M_string_length & 0xfffffffc) == 0) {
    return 0x14;
  }
  TreeModel::findParentOfType(&parentVolumeIndex,this->model,parent,'A');
  if ((((parentVolumeIndex.r < 0) || (parentVolumeIndex.c < 0)) ||
      (parentVolumeIndex.m == (TreeModel *)0x0)) ||
     (bVar3 = TreeModel::hasEmptyParsingData(this->model,&parentVolumeIndex), bVar3)) {
    ffsSize = (UINT8 *)(section->d)._M_dataplus._M_p;
  }
  else {
    TreeModel::parsingData(&header,this->model,&parentVolumeIndex);
    cVar1 = header.d._M_dataplus._M_p[0x19];
    std::__cxx11::string::~string((string *)&header);
    ffsSize = (UINT8 *)(section->d)._M_dataplus._M_p;
    if ((cVar1 == '\x03') && (UVar4 = uint24ToUint32(ffsSize), UVar4 == 0xffffff)) {
      puVar5 = (ushort *)(ffsSize + 8);
      uVar6 = 10;
      goto LAB_0011bb2c;
    }
  }
  puVar5 = (ushort *)(ffsSize + 4);
  uVar6 = 6;
LAB_0011bb2c:
  if ((uint)(section->d)._M_string_length < uVar6) {
    return 0x14;
  }
  type = ffsSize[3];
  uVar2 = *puVar5;
  UByteArray::left(&header,section,uVar6);
  UByteArray::mid(&body,section,uVar6,-1);
  sectionTypeToUString((CBString *)&local_108,type);
  Bstrlib::CBString::operator+(&name,(CBString *)&local_108," section");
  Bstrlib::CBString::~CBString((CBString *)&local_108);
  uVar6 = (uint)(section->d)._M_string_length;
  usprintf(&info,
           "Type: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nBuild number: %u"
           ,(ulong)type,(ulong)uVar6,(ulong)uVar6,(ulong)(uint)header.d._M_string_length,
           (ulong)(uint)header.d._M_string_length,(ulong)(uint)body.d._M_string_length,
           (ulong)(uint)body.d._M_string_length,(ulong)uVar2);
  if (insertIntoTree) {
    this_00 = this->model;
    Bstrlib::CBString::CBString(&local_78);
    local_108.d._M_dataplus._M_p = (pointer)&local_108.d.field_2;
    local_108.d._M_string_length = 0;
    local_108.d.field_2._M_local_buf[0] = '\0';
    TreeModel::addItem(&local_60,this_00,localOffset,'C',type,&name,&local_78,&info,&header,&body,
                       &local_108,Movable,parent,'\0');
    index->m = local_60.m;
    index->r = local_60.r;
    index->c = local_60.c;
    index->i = local_60.i;
    std::__cxx11::string::~string((string *)&local_108);
    Bstrlib::CBString::~CBString(&local_78);
  }
  Bstrlib::CBString::~CBString(&info);
  Bstrlib::CBString::~CBString(&name);
  std::__cxx11::string::~string((string *)&body);
  std::__cxx11::string::~string((string *)&header);
  return 0;
}

Assistant:

USTATUS FfsParser::parseVersionSectionHeader(const UByteArray & section, const UINT32 localOffset, const UModelIndex & parent, UModelIndex & index, const bool insertIntoTree)
{
    // Check sanity
    if ((UINT32)section.size() < sizeof(EFI_COMMON_SECTION_HEADER))
        return U_INVALID_SECTION;
    
    // Obtain required information from parent volume
    UINT8 ffsVersion = 2;
    UModelIndex parentVolumeIndex = model->findParentOfType(parent, Types::Volume);
    if (parentVolumeIndex.isValid() && model->hasEmptyParsingData(parentVolumeIndex) == false) {
        UByteArray data = model->parsingData(parentVolumeIndex);
        const VOLUME_PARSING_DATA* pdata = (const VOLUME_PARSING_DATA*)data.constData();
        ffsVersion = pdata->ffsVersion;
    }
    
    // Obtain header fields
    UINT32 headerSize;
    UINT16 buildNumber;
    UINT8 type;
    const EFI_COMMON_SECTION_HEADER* sectionHeader = (const EFI_COMMON_SECTION_HEADER*)(section.constData());
    const EFI_COMMON_SECTION_HEADER2* section2Header = (const EFI_COMMON_SECTION_HEADER2*)(section.constData());
    
    if (ffsVersion == 3 && uint24ToUint32(sectionHeader->Size) == EFI_SECTION2_IS_USED) { // Check for extended header section
        const EFI_VERSION_SECTION* versionHeader = (const EFI_VERSION_SECTION*)(section2Header + 1);
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER2) + sizeof(EFI_VERSION_SECTION);
        buildNumber = versionHeader->BuildNumber;
        type = section2Header->Type;
    }
    else { // Normal section
        const EFI_VERSION_SECTION* versionHeader = (const EFI_VERSION_SECTION*)(sectionHeader + 1);
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER) + sizeof(EFI_VERSION_SECTION);
        buildNumber = versionHeader->BuildNumber;
        type = sectionHeader->Type;
    }
    
    // Check sanity again
    if ((UINT32)section.size() < headerSize)
        return U_INVALID_SECTION;
    
    UByteArray header = section.left(headerSize);
    UByteArray body = section.mid(headerSize);
    
    // Get info
    UString name = sectionTypeToUString(type) + (" section");
    UString info = usprintf("Type: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nBuild number: %u",
                            type,
                            (UINT32)section.size(), (UINT32)section.size(),
                            (UINT32)header.size(), (UINT32)header.size(),
                            (UINT32)body.size(), (UINT32)body.size(),
                            buildNumber);
    
    // Add tree item
    if (insertIntoTree) {
        index = model->addItem(localOffset, Types::Section, type, name, UString(), info, header, body, UByteArray(), Movable, parent);
    }
    
    return U_SUCCESS;
}